

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMDBitSet.cpp
# Opt level: O2

OpenMDBitSet *
OpenMD::operator^(OpenMDBitSet *__return_storage_ptr__,OpenMDBitSet *bs1,OpenMDBitSet *bs2)

{
  std::vector<bool,_std::allocator<bool>_>::vector(&__return_storage_ptr__->bitset_,&bs1->bitset_);
  OpenMDBitSet::xorOperator(__return_storage_ptr__,bs2);
  return __return_storage_ptr__;
}

Assistant:

OpenMDBitSet operator^(const OpenMDBitSet& bs1, const OpenMDBitSet& bs2) {
    assert(bs1.size() == bs2.size());

    OpenMDBitSet result(bs1);
    result ^= bs2;
    return result;
  }